

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.h
# Opt level: O2

void __thiscall
cmOutputRequiredFilesCommand::~cmOutputRequiredFilesCommand(cmOutputRequiredFilesCommand *this)

{
  ~cmOutputRequiredFilesCommand(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

cmCommand* Clone() override { return new cmOutputRequiredFilesCommand; }